

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError MuxImagePush(WebPMuxImage *wpi,WebPMuxImage **wpi_list)

{
  WebPChunk *pWVar1;
  WebPChunk *pWVar2;
  WebPChunk *pWVar3;
  WebPChunk *pWVar4;
  WebPMuxImage **ppWVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  WebPMuxError WVar9;
  WebPMuxImage *pWVar10;
  WebPMuxImage **ppWVar11;
  
  pWVar10 = *wpi_list;
  ppWVar5 = wpi_list;
  for (; ppWVar11 = wpi_list, pWVar10 != (WebPMuxImage *)0x0; pWVar10 = pWVar10->next_) {
    wpi_list = &pWVar10->next_;
    ppWVar5 = ppWVar11;
  }
  pWVar10 = (WebPMuxImage *)WebPSafeMalloc(1,0x38);
  if (pWVar10 == (WebPMuxImage *)0x0) {
    WVar9 = WEBP_MUX_MEMORY_ERROR;
  }
  else {
    pWVar1 = wpi->header_;
    pWVar2 = wpi->alpha_;
    pWVar3 = wpi->img_;
    pWVar4 = wpi->unknown_;
    iVar6 = wpi->height_;
    iVar7 = wpi->has_alpha_;
    iVar8 = wpi->is_partial_;
    pWVar10->width_ = wpi->width_;
    pWVar10->height_ = iVar6;
    pWVar10->has_alpha_ = iVar7;
    pWVar10->is_partial_ = iVar8;
    pWVar10->img_ = pWVar3;
    pWVar10->unknown_ = pWVar4;
    pWVar10->header_ = pWVar1;
    pWVar10->alpha_ = pWVar2;
    pWVar10->next_ = (WebPMuxImage *)0x0;
    ppWVar11 = &(*ppWVar5)->next_;
    if (*ppWVar5 == (WebPMuxImage *)0x0) {
      ppWVar11 = ppWVar5;
    }
    *ppWVar11 = pWVar10;
    WVar9 = WEBP_MUX_OK;
  }
  return WVar9;
}

Assistant:

WebPMuxError MuxImagePush(const WebPMuxImage* wpi, WebPMuxImage** wpi_list) {
  WebPMuxImage* new_wpi;

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    if (cur_wpi->next_ == NULL) break;
    wpi_list = &cur_wpi->next_;
  }

  new_wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*new_wpi));
  if (new_wpi == NULL) return WEBP_MUX_MEMORY_ERROR;
  *new_wpi = *wpi;
  new_wpi->next_ = NULL;

  if (*wpi_list != NULL) {
    (*wpi_list)->next_ = new_wpi;
  } else {
    *wpi_list = new_wpi;
  }
  return WEBP_MUX_OK;
}